

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::~InlinedVector(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 *this)

{
  this->nStored = 0;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
  deallocate_object<pbrt::ParsedParameter*>
            ((polymorphic_allocator<pbrt::ParsedParameter*> *)this,this->ptr,this->nAlloc);
  return;
}

Assistant:

~InlinedVector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }